

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

void __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::eraseNode
          (iterator *this,uint32_t level,allocator_type *alloc)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  BranchNode<int,_12U,_false> *pBVar5;
  undefined8 in_RDX;
  int in_ESI;
  BranchNode<int,_12U,_false> *in_RDI;
  uint32_t size;
  uint32_t offset_1;
  BranchNode<int,_12U,_false> *parent;
  uint32_t offset;
  Path *path;
  IntervalMap<int,_int,_0U> *map;
  uint32_t in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  uint32_t level_00;
  IntervalMap<int,_int,_0U> *this_00;
  uint32_t level_01;
  undefined4 in_stack_fffffffffffffff0;
  
  level_01 = (uint32_t)((ulong)in_RDX >> 0x20);
  this_00 = (IntervalMap<int,_int,_0U> *)
            (in_RDI->
            super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
            ).first[0].pip.value;
  level_00 = (uint32_t)
             ((ulong)((in_RDI->
                      super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
                      ).first + 1) >> 0x20);
  iVar2 = in_ESI + -1;
  uVar3 = (uint32_t)((ulong)in_RDI >> 0x20);
  if (iVar2 == 0) {
    puVar4 = IntervalMapDetails::Path::offset
                       ((Path *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar3)
    ;
    in_stack_ffffffffffffffd4 = *puVar4;
    IntervalMapDetails::
    NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>::
    erase((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
           *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,0);
    uVar3 = (uint32_t)((ulong)in_RDI >> 0x20);
    this_00->rootSize = this_00->rootSize - 1;
    IntervalMapDetails::Path::setSize
              ((Path *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (uint32_t)in_stack_ffffffffffffffc8);
    bVar1 = IntervalMap<int,_int,_0U>::empty(this_00);
    if (bVar1) {
      switchToLeaf((IntervalMap<int,_int,_0U> *)0x833702);
      IntervalMap<int,_int,_0U>::const_iterator::setRoot
                ((const_iterator *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 uVar3);
      return;
    }
  }
  else {
    pBVar5 = IntervalMapDetails::Path::node<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                       ((Path *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar3)
    ;
    uVar3 = IntervalMapDetails::Path::size
                      ((Path *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (uint32_t)((ulong)in_RDI >> 0x20));
    if (uVar3 == 1) {
      PoolAllocator<char,192ul,64ul>::destroy<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                ((PoolAllocator<char,_192UL,_64UL> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
      uVar3 = (uint32_t)((ulong)in_RDI >> 0x20);
      eraseNode((iterator *)CONCAT44(iVar2,in_stack_fffffffffffffff0),level_01,
                (allocator_type *)this_00);
    }
    else {
      puVar4 = IntervalMapDetails::Path::offset
                         ((Path *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (uint32_t)((ulong)in_RDI >> 0x20));
      in_stack_ffffffffffffffc4 = *puVar4;
      in_stack_ffffffffffffffc0 =
           IntervalMapDetails::Path::size
                     ((Path *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (uint32_t)((ulong)in_RDI >> 0x20));
      IntervalMapDetails::
      NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>::
      erase((NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
            (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,0);
      uVar3 = (uint32_t)((ulong)in_RDI >> 0x20);
      IntervalMapDetails::Path::setSize
                ((Path *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (uint32_t)((ulong)pBVar5 >> 0x20),(uint32_t)pBVar5);
      recomputeBounds((iterator *)parent,offset_1);
    }
  }
  bVar1 = IntervalMapDetails::Path::valid
                    ((Path *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    IntervalMapDetails::Path::reset((Path *)this_00,level_00);
    puVar4 = IntervalMapDetails::Path::offset
                       ((Path *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),uVar3)
    ;
    *puVar4 = 0;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::eraseNode(uint32_t level, allocator_type& alloc) {
    SLANG_ASSERT(level > 0);
    auto& map = *this->map;
    auto& path = this->path;

    if (--level == 0) {
        uint32_t offset = path.offset(0);
        map.rootBranch.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        if (map.empty()) {
            map.switchToLeaf();
            this->setRoot(0);
            return;
        }
    }
    else {
        auto& parent = path.template node<Branch>(level);
        if (path.size(level) == 1) {
            // Branch node became empty, remove it recursively.
            alloc.destroy(&parent);
            eraseNode(level, alloc);
        }
        else {
            // N.B. see note about updating parent bounds in erase()
            uint32_t offset = path.offset(level);
            uint32_t size = path.size(level);
            parent.erase(offset, offset + 1, size);
            path.setSize(level, size - 1);
            recomputeBounds(level);
        }
    }

    if (path.valid()) {
        path.reset(level + 1);
        path.offset(level + 1) = 0;
    }
}